

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O2

void cmCacheManager::OutputNewlineTruncationWarning
               (ostream *fout,string *key,string *value,cmMessenger *messenger)

{
  long lVar1;
  string comment;
  cmAlphaNum local_88;
  cmAlphaNum local_58;
  
  lVar1 = std::__cxx11::string::find((char)value,10);
  if (lVar1 != -1) {
    if (messenger != (cmMessenger *)0x0) {
      local_88.View_._M_len = (size_t)&DAT_00000009;
      local_88.View_._M_str = "Value of ";
      local_58.View_._M_str = (key->_M_dataplus)._M_p;
      local_58.View_._M_len = key->_M_string_length;
      cmStrCat<char[33]>(&comment,&local_88,&local_58,
                         (char (*) [33])" contained a newline; truncating");
      local_88.View_._M_len = 0;
      local_88.View_._M_str = (char *)0x0;
      cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack
                ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)&local_88);
      cmMessenger::IssueMessage(messenger,WARNING,&comment,(cmListFileBacktrace *)&local_88);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_88.View_._M_str);
      std::__cxx11::string::~string((string *)&comment);
    }
    local_88.View_._M_len = 0x12;
    local_88.View_._M_str = "WARNING: Value of ";
    local_58.View_._M_str = (key->_M_dataplus)._M_p;
    local_58.View_._M_len = key->_M_string_length;
    cmStrCat<char[56]>(&comment,&local_88,&local_58,
                       (char (*) [56])" contained a newline and was truncated. Original value:");
    OutputWarningComment(fout,&comment,true);
    OutputWarningComment(fout,value,false);
    std::__cxx11::string::~string((string *)&comment);
  }
  return;
}

Assistant:

void cmCacheManager::OutputNewlineTruncationWarning(std::ostream& fout,
                                                    std::string const& key,
                                                    std::string const& value,
                                                    cmMessenger* messenger)
{
  if (value.find('\n') != std::string::npos) {
    if (messenger) {
      std::string message =
        cmStrCat("Value of ", key, " contained a newline; truncating");
      messenger->IssueMessage(MessageType::WARNING, message);
    }

    std::string comment =
      cmStrCat("WARNING: Value of ", key,
               " contained a newline and was truncated. Original value:");

    OutputWarningComment(fout, comment, true);
    OutputWarningComment(fout, value, false);
  }
}